

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropagatorTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::propagation::Propagator_testBinaryPropagation_Test::TestBody
          (Propagator_testBinaryPropagation_Test *this)

{
  undefined1 auVar1 [16];
  char cVar2;
  uint uVar3;
  mapped_type *pmVar4;
  uint uVar5;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen_00;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *extraout_RDX;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *extraout_RDX_00;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *extraout_RDX_01;
  long lVar6;
  char *pcVar7;
  ulong spanID;
  ulong parentID;
  AssertionResult gtest_ar;
  BinaryPropagator binaryPropagator;
  string value;
  StrMap baggage;
  SpanContext ctx;
  stringstream ss;
  random_device randomDevice;
  AssertHelper local_1718 [8];
  TraceID local_1710;
  ulong local_1700;
  BinaryPropagator local_16f8;
  SpanContext local_16d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1628;
  SpanContext local_15f0;
  stringstream local_1540 [16];
  ostream local_1530 [112];
  ios_base local_14c0 [264];
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  std::__cxx11::stringstream::stringstream(local_1540);
  local_13b8.field_0._M_file = (void *)0x0;
  local_13b8.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  BinaryPropagator::BinaryPropagator
            (&local_16f8,(shared_ptr<jaegertracing::metrics::Metrics> *)&local_13b8.field_0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_13b8.field_0._M_func !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_13b8.field_0._M_func);
  }
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar3 = std::random_device::_M_getval();
  uVar5 = uVar3 / 0x7fffffff << 0x1f | uVar3 / 0x7fffffff;
  local_1700 = (ulong)(uVar5 + uVar3 + (uint)(uVar3 + uVar5 == 0)) * 0x41a7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1700;
  gen = SUB168(auVar1 * ZEXT816(0x400000008001),8);
  local_1700 = ((ulong)gen >> 0xd & 0x7ffff) * -0x7fffffff + local_1700;
  local_1628._M_buckets = &local_1628._M_single_bucket;
  local_1628._M_bucket_count = 1;
  local_1628._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1628._M_element_count = 0;
  local_1628._M_rehash_policy._M_max_load_factor = 1.0;
  local_1628._M_rehash_policy._M_next_resize = 0;
  local_1628._M_single_bucket = (__node_base_ptr)0x0;
  lVar6 = -(ulong)((int)local_1700 + (uint)(local_1700 * 0x38e38e39 >> 0x21) * -9 + 1);
  do {
    (anonymous_namespace)::
    randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              ((string *)&local_15f0,(_anonymous_namespace_ *)&local_1700,gen);
    (anonymous_namespace)::
    randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              ((string *)&local_16d8,(_anonymous_namespace_ *)&local_1700,gen_00);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&local_1628,(key_type *)&local_15f0);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    gen = extraout_RDX;
    if (local_16d8.super_SpanContext._vptr_SpanContext != (_func_int **)&local_16d8._traceID._low) {
      operator_delete(local_16d8.super_SpanContext._vptr_SpanContext);
      gen = extraout_RDX_00;
    }
    if (local_15f0.super_SpanContext._vptr_SpanContext != (_func_int **)&local_15f0._traceID._low) {
      operator_delete(local_15f0.super_SpanContext._vptr_SpanContext);
      gen = extraout_RDX_01;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  local_1710._high = (local_1700 * 0x41a7) % 0x7fffffff;
  local_1710._low = (local_1710._high * 0x41a7) % 0x7fffffff;
  spanID = (local_1710._low * 0x41a7) % 0x7fffffff;
  parentID = (spanID * 0x41a7) % 0x7fffffff;
  local_16d8.super_SpanContext._vptr_SpanContext = (_func_int **)&local_16d8._traceID._low;
  pcVar7 = "";
  local_1700 = parentID;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16d8,"","");
  SpanContext::SpanContext
            (&local_15f0,&local_1710,spanID,parentID,'\0',(StrMap *)&local_1628,
             (string *)&local_16d8);
  if (local_16d8.super_SpanContext._vptr_SpanContext != (_func_int **)&local_16d8._traceID._low) {
    operator_delete(local_16d8.super_SpanContext._vptr_SpanContext);
  }
  BinaryPropagator::inject(&local_16f8,&local_15f0,local_1530);
  BinaryPropagator::extract(&local_16d8,&local_16f8,(istream *)local_1540);
  testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
            ((internal *)&local_1710,"ctx","binaryPropagator.extract(ss)",&local_15f0,&local_16d8);
  local_16d8.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8._debugID._M_dataplus._M_p != &local_16d8._debugID.field_2) {
    operator_delete(local_16d8._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_16d8._baggage._M_h);
  if ((char)local_1710._high == '\0') {
    testing::Message::Message((Message *)&local_16d8);
    if ((undefined8 *)local_1710._low != (undefined8 *)0x0) {
      pcVar7 = *(char **)local_1710._low;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1718,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/propagation/PropagatorTest.cpp"
               ,0x44,pcVar7);
    testing::internal::AssertHelper::operator=(local_1718,(Message *)&local_16d8);
    testing::internal::AssertHelper::~AssertHelper(local_1718);
    if (local_16d8.super_SpanContext._vptr_SpanContext != (_func_int **)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_16d8.super_SpanContext._vptr_SpanContext != (_func_int **)0x0))
      {
        (**(code **)(*local_16d8.super_SpanContext._vptr_SpanContext + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1710._low,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_15f0.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15f0._debugID._M_dataplus._M_p != &local_15f0._debugID.field_2) {
    operator_delete(local_15f0._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_15f0._baggage._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1628);
  std::random_device::_M_fini();
  local_16f8.super_Extractor<std::basic_istream<char,_std::char_traits<char>_>_&>._vptr_Extractor =
       (_func_int **)&PTR__BinaryPropagator_0020d280;
  local_16f8.super_Injector<std::basic_ostream<char,_std::char_traits<char>_>_&>._vptr_Injector =
       (_func_int **)&PTR__BinaryPropagator_0020d2b0;
  if (local_16f8._metrics.
      super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_16f8._metrics.
               super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__cxx11::stringstream::~stringstream(local_1540);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

TEST(Propagator, testBinaryPropagation)
{
    std::stringstream ss;
    BinaryPropagator binaryPropagator;
    std::random_device randomDevice;
    std::default_random_engine engine(randomDevice());
    constexpr auto kMaxNumBaggageItems = 10;
    const auto numBaggageItems = engine() % (kMaxNumBaggageItems - 1) + 1;
    SpanContext::StrMap baggage;
    for (auto i = static_cast<size_t>(0); i < numBaggageItems; ++i) {
        const auto key = randomStr(engine);
        const auto value = randomStr(engine);
        baggage[key] = value;
    }
    SpanContext ctx(
        TraceID(engine(), engine()), engine(), engine(), 0, baggage);
    binaryPropagator.inject(ctx, ss);
    ASSERT_EQ(ctx, binaryPropagator.extract(ss));
}